

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

shared_ptr<rcg::System> __thiscall rcg::Interface::getParent(Interface *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<rcg::System> sVar1;
  
  std::__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<rcg::System>)sVar1.super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<System> Interface::getParent() const
{
  return parent;
}